

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

double __thiscall ary::BinaryPattern::match(BinaryPattern *this,Mat *src,int *orientation)

{
  _InputArray *p_Var1;
  pointer pMVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Scalar mean_int;
  Scalar std_int;
  Scalar mean_ext;
  Mat interior;
  Scalar std_ext;
  double local_198;
  _InputArray local_190;
  double local_170;
  double local_168;
  _InputArray local_160;
  _OutputArray local_148;
  Range local_130;
  int *local_128;
  double local_120;
  double local_118 [12];
  Mat local_b8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_118[10] = 0.0;
  local_118[0xb] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_190.flags = 0x19;
  local_190._4_4_ = 0x4b;
  local_160.flags = 0x19;
  local_160._4_4_ = 0x4b;
  local_128 = orientation;
  cv::Mat::Mat(&local_b8,src,(Range *)&local_190,(Range *)&local_160);
  local_190.sz.width = 0;
  local_190.sz.height = 0;
  local_190.flags = 0x1010000;
  local_160.flags = -0x3dfdfffa;
  local_160.sz.width = 1;
  local_160.sz.height = 4;
  local_148.super__InputArray.flags = -0x3dfdfffa;
  local_148.super__InputArray.sz.width = 1;
  local_148.super__InputArray.sz.height = 4;
  local_190.obj = src;
  local_160.obj = local_118 + 8;
  local_148.super__InputArray.obj = &local_58;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_190,(_OutputArray *)&local_160,&local_148,p_Var1);
  local_190.sz.width = 0;
  local_190.sz.height = 0;
  local_190.flags = 0x1010000;
  local_160.flags = -0x3dfdfffa;
  local_160.obj = local_118;
  local_160.sz.width = 1;
  local_160.sz.height = 4;
  local_148.super__InputArray.flags = -0x3dfdfffa;
  local_148.super__InputArray.obj = local_118 + 4;
  local_148.super__InputArray.sz.width = 1;
  local_148.super__InputArray.sz.height = 4;
  local_190.obj = &local_b8;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_190,(_OutputArray *)&local_160,&local_148,p_Var1);
  local_198 = -1.0;
  if (local_118[8] <= local_118[0]) {
    local_190.sz.width = 0;
    local_190.sz.height = 0;
    local_190.flags = 0x1010000;
    local_190.obj = &local_b8;
    p_Var1 = (_InputArray *)cv::noArray();
    local_170 = (double)cv::norm(&local_190,4,p_Var1);
    pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish != pMVar2) {
      local_170 = local_170 * local_170;
      local_198 = -1.0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        local_190.obj =
             (void *)((long)&((Mat *)(&((Mat *)(&((Mat *)(&pMVar2->step + -3))->step + -3))->step +
                                     -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_190.sz.width = 0;
        local_190.sz.height = 0;
        local_190.flags = 0x1010000;
        p_Var1 = (_InputArray *)cv::noArray();
        local_168 = (double)cv::norm(&local_190,4,p_Var1);
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
LAB_00114658:
          uVar3 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar6);
          cv::Mat::~Mat(&local_b8);
          _Unwind_Resume(uVar3);
        }
        local_160.obj =
             (void *)((long)&((Mat *)(&pMVar2->step + -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_160.sz.width = 0;
        local_160.sz.height = 0;
        local_160.flags = 0x1010000;
        cv::noArray();
        cv::mean(&local_190,&local_160);
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
          goto LAB_00114658;
        }
        local_130.start = local_190.flags;
        local_130.end = local_190._4_4_;
        local_190.obj =
             (void *)((long)&((Mat *)(&pMVar2->step + -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_190.sz.width = 0;
        local_190.sz.height = 0;
        local_190.flags = 0x1010000;
        dVar7 = (double)cv::Mat::dot((_InputArray *)&local_b8);
        dVar9 = local_118[0] * -2500.0;
        dVar8 = ((double)local_130 * -2500.0 * (double)local_130 + local_168 * local_168) *
                (local_118[0] * dVar9 + local_170);
        if (dVar8 < 0.0) {
          local_168 = dVar9;
          local_120 = dVar7;
          dVar8 = sqrt(dVar8);
          dVar9 = local_168;
          dVar7 = local_120;
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar8 = (dVar9 * (double)local_130 + dVar7) / dVar8;
        if (local_198 < dVar8) {
          *local_128 = (int)uVar6;
          local_198 = dVar8;
        }
        uVar6 = uVar6 + 1;
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        lVar5 = lVar5 + 0x60;
      } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
    }
  }
  cv::Mat::~Mat(&local_b8);
  return local_198;
}

Assistant:

double BinaryPattern::match(const Mat& src, int& orientation) {

	int i;
	double tempsim;
	double N = (double)(PATTERN_SIZE * PATTERN_SIZE / 4);
	double nom, den;

	Scalar mean_ext, std_ext, mean_int, std_int;

	Mat interior = src(cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4), cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4));

	meanStdDev(src, mean_ext, std_ext);
	meanStdDev(interior, mean_int, std_int);

	//printf("ext: %f int: %f \n", mean_ext.val[0], mean_int.val[0]);

	if ((mean_ext.val[0] > mean_int.val[0]))
		return -1;

	double normSrcSq = pow(norm(interior), 2);

	//zero_mean_mode;
	int zero_mean_mode = 1;

	//use correlation coefficient as a robust similarity measure
	double confidence = -1.0;
	for (i = 0; i < markers.size(); i++) {

		double const nnn = pow(norm(markers.at(i)), 2);

		if (zero_mean_mode == 1) {

			double const mmm = mean(markers.at(i)).val[0];

			nom = interior.dot(markers.at(i)) - (N * mean_int.val[0] * mmm);
			den = sqrt( (normSrcSq - (N * mean_int.val[0] * mean_int.val[0]) ) * (nnn - (N * mmm * mmm)));
			tempsim = nom / den;
		}
		else
		{
			tempsim = interior.dot(markers.at(i)) / (sqrt(normSrcSq * nnn));
		}

		if (tempsim > confidence) {
			confidence = tempsim;
			orientation = i;
		}
	}

	return confidence;
}